

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O1

ecs_entity_t find_child_in_table(ecs_table_t *table,char *name)

{
  char *__s1;
  bool bVar1;
  _Bool _Var2;
  int32_t iVar3;
  uint uVar4;
  int iVar5;
  ecs_data_t *peVar6;
  ecs_entity_t eVar7;
  void *pvVar8;
  ecs_entity_t *peVar9;
  undefined8 *puVar10;
  ulong uVar11;
  ecs_entity_t local_40;
  
  iVar3 = ecs_type_index_of(table->type,6);
  if ((((iVar3 != -1) && (peVar6 = ecs_table_get_data(table), peVar6 != (ecs_data_t *)0x0)) &&
      (peVar6->columns != (ecs_column_t *)0x0)) &&
     (uVar4 = ecs_vector_count(peVar6->entities), uVar4 != 0)) {
    _Var2 = is_number(name);
    if (_Var2) {
      eVar7 = name_to_id(name);
      return eVar7;
    }
    pvVar8 = _ecs_vector_first(peVar6->columns[iVar3].data,0x18,0x10);
    if (0 < (int)uVar4) {
      puVar10 = (undefined8 *)((long)pvVar8 + 8);
      uVar11 = 0;
      while( true ) {
        __s1 = (char *)*puVar10;
        if ((((char *)puVar10[-1] != (char *)0x0) &&
            (iVar5 = strcmp((char *)puVar10[-1],name), iVar5 == 0)) ||
           ((bVar1 = true, __s1 != (char *)0x0 && (iVar5 = strcmp(__s1,name), iVar5 == 0)))) {
          peVar9 = (ecs_entity_t *)_ecs_vector_get(peVar6->entities,8,0x10,(int32_t)uVar11);
          local_40 = *peVar9;
          bVar1 = false;
        }
        if (!bVar1) break;
        uVar11 = uVar11 + 1;
        puVar10 = puVar10 + 3;
        if (uVar4 == uVar11) {
          return 0;
        }
      }
      return local_40;
    }
  }
  return 0;
}

Assistant:

static
ecs_entity_t find_child_in_table(
    ecs_table_t *table,
    const char *name)
{
    /* If table doesn't have EcsName, then don't bother */
    int32_t name_index = ecs_type_index_of(table->type, ecs_typeid(EcsName));
    if (name_index == -1) {
        return 0;
    }

    ecs_data_t *data = ecs_table_get_data(table);
    if (!data || !data->columns) {
        return 0;
    }

    int32_t i, count = ecs_vector_count(data->entities);
    if (!count) {
        return 0;
    }

    if (is_number(name)) {
        return name_to_id(name);
    }

    ecs_column_t *column = &data->columns[name_index];
    EcsName *names = ecs_vector_first(column->data, EcsName);

    for (i = 0; i < count; i ++) {
        const char *cur_name = names[i].value;
        const char *cur_sym = names[i].symbol;
        if ((cur_name && !strcmp(cur_name, name)) || (cur_sym && !strcmp(cur_sym, name))) {
            return *ecs_vector_get(data->entities, ecs_entity_t, i);
        }
    }

    return 0;
}